

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_data.c
# Opt level: O0

int iterdata(long totaln,long offset,long firstn,long nrows,int narray,iteratorCol *iter_col,
            void *usrdata)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  char *pcVar6;
  size_t sVar7;
  bool bVar8;
  long local_88;
  long nelem;
  long l;
  long k;
  long j;
  char *pcStack_60;
  int i;
  char *floatvalue;
  uchar *ucdata;
  char **cdata;
  uchar *ldata;
  double *data;
  iteratorCol *iter_col_local;
  int narray_local;
  long nrows_local;
  long firstn_local;
  long offset_local;
  long totaln_local;
  
  if (firstn == 1) {
    iterdata::usrpt = (UserIter *)usrdata;
    iterdata::nnum = *usrdata;
    iterdata::ncmp = *(int *)((long)usrdata + 4);
    iterdata::ntxt = *(int *)((long)usrdata + 0x38);
    iterdata::nfloat = *(int *)((long)usrdata + 8);
    iterdata::flag_minmax = (int *)calloc((long)(iterdata::nnum + iterdata::ncmp),4);
    iterdata::repeat = (long *)calloc((long)narray,8);
    iterdata::datatype = (int *)calloc((long)narray,4);
    for (j._4_4_ = 0; j._4_4_ < narray; j._4_4_ = j._4_4_ + 1) {
      lVar3 = fits_iter_get_repeat(iter_col + j._4_4_);
      iterdata::repeat[j._4_4_] = lVar3;
      iVar1 = fits_iter_get_datatype(iter_col + j._4_4_);
      iterdata::datatype[j._4_4_] = iVar1;
    }
    iterdata::find_badbit = 0;
    iterdata::find_baddot = 0;
    iterdata::find_badspace = 0;
    iterdata::find_badchar = 0;
    iterdata::find_badlog = 0;
  }
  for (j._4_4_ = 0; j._4_4_ < iterdata::nnum + iterdata::ncmp; j._4_4_ = j._4_4_ + 1) {
    lVar3 = fits_iter_get_array(iter_col + j._4_4_);
    local_88 = nrows * iterdata::repeat[j._4_4_];
    if (iterdata::nnum <= j._4_4_) {
      local_88 = nrows * 2 * iterdata::repeat[j._4_4_];
    }
    if ((local_88 != 0) && (iterdata::find_badbit = 0, iterdata::usrpt->indatatyp[j._4_4_] == 1)) {
      l = 0;
LAB_001076e5:
      if (l < nrows) {
        uVar2 = (uint)*(double *)(lVar3 + (l + 1) * iterdata::repeat[j._4_4_] * 8);
        iterdata::bdata = (uchar)uVar2;
        if ((uVar2 & 0xff & (uint)iterdata::usrpt->mask[j._4_4_]) == 0) goto LAB_00107876;
        uVar2 = fits_iter_get_colnum(iter_col + j._4_4_);
        sprintf(errmes,"Row #%ld, and Column #%d: X vector ",firstn + l,(ulong)uVar2);
        for (nelem = 1; nelem <= iterdata::repeat[j._4_4_]; nelem = nelem + 1) {
          sprintf(comm,"0x%02x ",
                  (ulong)((int)*(double *)(lVar3 + (l * iterdata::repeat[j._4_4_] + nelem) * 8) &
                         0xff));
          strcat(errmes,comm);
        }
        strcat(errmes,"is not left justified.");
        wrterr(iterdata::usrpt->out,errmes,2);
        strcpy(errmes,"             (Other rows may have errors).");
        print_fmt(iterdata::usrpt->out,errmes,0xd);
        iterdata::find_badbit = 1;
      }
    }
  }
  j._4_4_ = iterdata::nnum + iterdata::ncmp;
  do {
    if (iterdata::nnum + iterdata::ncmp + iterdata::ntxt <= j._4_4_) {
      j._4_4_ = iterdata::nnum + iterdata::ncmp + iterdata::ntxt;
      do {
        if (iterdata::nnum + iterdata::ncmp + iterdata::ntxt + iterdata::nfloat <= j._4_4_) {
          if (firstn + nrows + -1 == totaln) {
            free(iterdata::flag_minmax);
            free(iterdata::datatype);
            free(iterdata::repeat);
          }
          return 0;
        }
        if (nrows != 0) {
          puVar5 = (undefined8 *)fits_iter_get_array(iter_col + j._4_4_);
          iterdata::find_baddot = 0;
          iterdata::find_badspace = 0;
          for (l = 0; l < nrows; l = l + 1) {
            pcStack_60 = (char *)puVar5[l + 1];
            iVar1 = strcmp((char *)*puVar5,pcStack_60);
            if ((iVar1 != 0) && (pcVar6 = strchr(pcStack_60,0x2e), pcVar6 == (char *)0x0)) {
              for (; *pcStack_60 == ' '; pcStack_60 = pcStack_60 + 1) {
              }
              sVar7 = strlen(pcStack_60);
              if (sVar7 != 0) {
                uVar2 = fits_iter_get_colnum(iter_col + j._4_4_);
                sprintf(errmes,"Number in row #%ld, column #%d has no decimal point:",firstn + l,
                        (ulong)uVar2);
                wrterr(iterdata::usrpt->out,errmes,1);
                strcpy(errmes,pcStack_60);
                strcat(errmes,"  (Other rows may have similar errors).");
                print_fmt(iterdata::usrpt->out,errmes,0xd);
                iterdata::find_baddot = 1;
                break;
              }
            }
          }
          if (iterdata::find_badspace == 0) {
            for (l = 0; l < nrows; l = l + 1) {
              pcStack_60 = (char *)puVar5[l + 1];
              iVar1 = strcmp((char *)*puVar5,pcStack_60);
              if (iVar1 != 0) {
                for (; *pcStack_60 == ' '; pcStack_60 = pcStack_60 + 1) {
                }
                nelem = strlen(pcStack_60);
                while( true ) {
                  nelem = nelem - 1;
                  bVar8 = false;
                  if (0 < nelem) {
                    bVar8 = pcStack_60[nelem] == ' ';
                  }
                  if (!bVar8) break;
                  pcStack_60[nelem] = '\0';
                }
                pcVar6 = strchr(pcStack_60,0x20);
                if (pcVar6 != (char *)0x0) {
                  uVar2 = fits_iter_get_colnum(iter_col + j._4_4_);
                  sprintf(errmes,"Number in row #%ld, column #%d has embedded space:",firstn + l,
                          (ulong)uVar2);
                  wrterr(iterdata::usrpt->out,errmes,1);
                  strcpy(errmes,pcStack_60);
                  strcat(errmes,"  (Other rows may have similar errors).");
                  print_fmt(iterdata::usrpt->out,errmes,0xd);
                  iterdata::find_badspace = 1;
                  break;
                }
              }
            }
          }
        }
        j._4_4_ = j._4_4_ + 1;
      } while( true );
    }
    if (iterdata::datatype[j._4_4_] == 0x10) {
      if (nrows != 0) {
        lVar3 = fits_iter_get_array(iter_col + j._4_4_);
        iterdata::find_badchar = 0;
        for (l = 0; l < nrows; l = l + 1) {
          lVar4 = *(long *)(lVar3 + 8 + l * 8);
          for (k = 0; *(char *)(lVar4 + k) != '\0'; k = k + 1) {
            if ((0x7e < *(byte *)(lVar4 + k)) || (*(byte *)(lVar4 + k) < 0x20)) {
              uVar2 = fits_iter_get_colnum(iter_col + j._4_4_);
              sprintf(errmes,"String in row #%ld, column #%d contains non-ASCII text.",firstn + l,
                      (ulong)uVar2);
              wrterr(iterdata::usrpt->out,errmes,1);
              strcpy(errmes,"             (Other rows may have errors).");
              print_fmt(iterdata::usrpt->out,errmes,0xd);
              iterdata::find_badchar = 1;
              break;
            }
          }
        }
      }
    }
    else if ((nrows * iterdata::repeat[j._4_4_] != 0) &&
            (lVar3 = fits_iter_get_array(iter_col + j._4_4_), iterdata::find_badlog == 0)) {
      for (k = 1; k <= nrows * iterdata::repeat[j._4_4_]; k = k + 1) {
        if (2 < *(byte *)(lVar3 + k)) {
          lVar4 = firstn + k + -2;
          lVar3 = iterdata::repeat[j._4_4_];
          uVar2 = fits_iter_get_colnum(iter_col + j._4_4_,(long)j._4_4_,lVar4 % lVar3);
          sprintf(errmes,"Logical value in row #%ld, column #%d not equal to \'T\', \'F\', or 0",
                  lVar4 / lVar3 + 1,(ulong)uVar2);
          wrterr(iterdata::usrpt->out,errmes,1);
          strcpy(errmes,"             (Other rows may have similar errors).");
          print_fmt(iterdata::usrpt->out,errmes,0xd);
          iterdata::find_badlog = 1;
          break;
        }
      }
    }
    j._4_4_ = j._4_4_ + 1;
  } while( true );
LAB_00107876:
  l = l + 1;
  goto LAB_001076e5;
}

Assistant:

int iterdata(long totaln, 
		 long offset, 
		 long firstn,
		 long nrows,
		 int narray,
		 iteratorCol *iter_col,
		 void *usrdata
		 )
{ 
    static UserIter *usrpt;
/*
    static FitsHdu  *hdupt;
*/
    static int nnum;
    static int ntxt;
    static int ncmp;
    static int nfloat;
    static int *flag_minmax = 0;			/* define the initial min and max value */
    static long *repeat;
    static int *datatype;
    static int find_badbit = 0; 
    static int find_baddot = 0; 
    static int find_badspace = 0; 
    static int find_badchar = 0; 
    static int find_badlog = 0; 

    double  *data;
    unsigned char *ldata;
    char **cdata;
    unsigned char *ucdata;
    char *floatvalue;

    /* bit column working space */
    static unsigned char bdata;

    int i; 
    long j,k,l;
    long nelem;

    if(firstn == 1 ) {  /* first time for this table, so initialize */
        usrpt = (UserIter *)usrdata;
/*
	hdupt= usrpt->hduptr;
*/
        nnum = usrpt->nnum;
        ncmp = usrpt->ncmp;
        ntxt = usrpt->ntxt;
        nfloat = usrpt->nfloat;
	flag_minmax = (int *)calloc(nnum+ncmp, sizeof(int));
	repeat   = (long *)calloc(narray,sizeof(long));
	datatype = (int *)calloc(narray,sizeof(int));
        for (i=0; i < narray; i++) {  
	    repeat[i] = fits_iter_get_repeat(&(iter_col[i]));
	    datatype[i] = fits_iter_get_datatype(&(iter_col[i])); 
        }
        find_badbit = 0; 
        find_baddot = 0; 
        find_badspace = 0; 
        find_badchar = 0; 
        find_badlog = 0; 
    }

    /* columns from  1 to nnum are scalar numerical columns. 
       columns from  nnum+1 to  nnum+ncmp are complex columns. (not used any more)
       columns from  nnum+ncmp are text columns */

    /* deal with the numerical column */
    for (i=0; i < nnum+ncmp; i++) { 
	data = (double *) fits_iter_get_array(&(iter_col[i]));
	j = 1;
	nelem = nrows * repeat[i];
	if(i >= nnum) nelem = 2 * nrows *repeat[i];
	if(nelem == 0) continue;
        find_badbit = 0;

        /* check for the bit jurisfication  */
        if(!find_badbit && usrpt->indatatyp[i] == TBIT ) { 
            for (k = 0; k < nrows; k++) {
               j = (k+1)*repeat[i];
               bdata = (unsigned char)data[j]; 
               if( bdata & usrpt->mask[i] ) { 
                  sprintf(errmes, 
                    "Row #%ld, and Column #%d: X vector ", firstn+k, 
                      fits_iter_get_colnum(&(iter_col[i]))); 
                  for (l = 1; l<= repeat[i]; l++) {
                     sprintf(comm, "0x%02x ", (unsigned char) data[k*repeat[i]+l]);
                     strcat(errmes,comm); 
                  }
                  strcat(errmes,"is not left justified."); 
                  wrterr(usrpt->out,errmes,2);
                  strcpy(errmes,
          "             (Other rows may have errors).");
                  print_fmt(usrpt->out,errmes,13);
                  find_badbit = 1;
                  break;
               }
            }
        }  
    }

    /* deal with character and logical columns */
    for (i = nnum + ncmp; i < nnum + ncmp + ntxt; i++) { 
        if(datatype[i] == TSTRING ) {	/* character */
            nelem = nrows;
	    if(nelem == 0) continue;
	    cdata = (char **) fits_iter_get_array(&(iter_col[i]));
            find_badchar = 0;

            /* test for illegal ASCII text characters > 126  or < 32 */
            if (!find_badchar) {
              for (k = 0; k < nrows; k++) {
                ucdata = (unsigned char *)cdata[k+1];
                j = 0;
                while (ucdata[j] != 0) {

                  if ((ucdata[j] > 126) || (ucdata[j] < 32)) {
                    sprintf(errmes, 
                    "String in row #%ld, column #%d contains non-ASCII text.", firstn+k, 
                      fits_iter_get_colnum(&(iter_col[i]))); 
                      wrterr(usrpt->out,errmes,1);
                      strcpy(errmes,
          "             (Other rows may have errors).");
                      print_fmt(usrpt->out,errmes,13);
                    find_badchar = 1;
                    break;
                  }
                  j++;
                }
              }
            }
        }

	else {  			/* logical value */
            nelem = nrows * repeat[i];
	    if(nelem == 0) continue;
	    ldata = (unsigned char *) fits_iter_get_array(&(iter_col[i]));

            /* test for illegal logical column values */
            /* The first element in the array gives the value that is used to represent nulls */
            if (!find_badlog) {
                for(j = 1; j <= nrows * repeat[i]; j++) {
                  if (ldata[j] > 2) {
                    sprintf(errmes, 
                    "Logical value in row #%ld, column #%d not equal to 'T', 'F', or 0", 
                       (firstn+j - 2)/repeat[i] +1, 
                       fits_iter_get_colnum(&(iter_col[i]))); 
                       wrterr(usrpt->out,errmes,1);
                       strcpy(errmes,
         "             (Other rows may have similar errors).");
                       print_fmt(usrpt->out,errmes,13);
                       find_badlog = 1;
                       break; 
                  }
                }
            }
        }
    }

    for (i = nnum + ncmp +ntxt; i < nnum + ncmp + ntxt + nfloat; i++) { 
            nelem = nrows;
	    if(nelem == 0) continue;
	    cdata = (char **) fits_iter_get_array(&(iter_col[i]));
            find_baddot = 0;
	    find_badspace = 0;

            /* test for missing (implicit) decimal point in floating point numbers */
            if (!find_baddot) {
              for (k = 0; k < nrows; k++) {
                floatvalue = (char *)cdata[k+1];
                if (strcmp(cdata[0], floatvalue) && !strchr(floatvalue, '.') ) {

		  while (*floatvalue == ' ')  /* skip leading spaces */
		        floatvalue++;

                  if (strlen(floatvalue)) {  /* ignore completely blank fields */
		  
                    sprintf(errmes, 
                     "Number in row #%ld, column #%d has no decimal point:", firstn+k, 
                     fits_iter_get_colnum(&(iter_col[i]))); 
                     wrterr(usrpt->out,errmes,1);
                     strcpy(errmes, floatvalue);
                     strcat(errmes,
                  "  (Other rows may have similar errors).");
                     print_fmt(usrpt->out,errmes,13);
                     find_baddot = 1;
                     break;
                  }
                }
              }
            }

            if (!find_badspace) {
              for (k = 0; k < nrows; k++) {
                floatvalue = (char *)cdata[k+1];

                if (strcmp(cdata[0], floatvalue) ) {  /* not a null value? */
		    while (*floatvalue == ' ')  /* skip leading spaces */
		        floatvalue++;

                    l = strlen(floatvalue) - 1;
		    while (l > 0 &&  floatvalue[l] == ' ') { /* remove trailing spaces */
		        floatvalue[l] = '\0';
			l--;
		    }

                    if (strchr(floatvalue, ' ') ) {
                      sprintf(errmes, 
                       "Number in row #%ld, column #%d has embedded space:", firstn+k, 
                         fits_iter_get_colnum(&(iter_col[i]))); 
                         wrterr(usrpt->out,errmes,1);
                         strcpy(errmes, floatvalue);
                         strcat(errmes,
                      "  (Other rows may have similar errors).");
                         print_fmt(usrpt->out,errmes,13);
                         find_badspace = 1;
                         break;
                    }
		}
            }
          }
    }

    if(firstn + nrows - 1 == totaln) { 
	free(flag_minmax);
	free(datatype);
	free(repeat); 
    }
    return 0; 
}